

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O3

Npn_Man_t * Npn_ManStart(char *pFileName)

{
  int iVar1;
  uint uVar2;
  Npn_Man_t *p;
  FILE *__stream;
  Npn_Obj_t *pNVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  p = (Npn_Man_t *)calloc(1,0x20);
  if (pFileName == (char *)0x0) {
    p->nBufferSize = 100;
    pNVar3 = (Npn_Obj_t *)malloc(0x640);
    p->pBuffer = pNVar3;
    uVar6 = 0x31;
    while( true ) {
      do {
        uVar2 = uVar6 + 1;
        uVar5 = uVar6 & 1;
        uVar6 = uVar2;
      } while (uVar5 != 0);
      if (uVar2 < 9) break;
      iVar7 = 5;
      while (uVar2 % (iVar7 - 2U) != 0) {
        uVar5 = iVar7 * iVar7;
        iVar7 = iVar7 + 2;
        if (uVar2 < uVar5) goto LAB_002e8e58;
      }
    }
LAB_002e8e58:
    p->nBins = uVar2;
    piVar4 = (int *)calloc((long)(int)uVar2,4);
    p->pBins = piVar4;
    p->nEntries = 1;
  }
  else {
    __stream = fopen(pFileName,"r");
    if (__stream == (FILE *)0x0) {
      p = (Npn_Man_t *)0x0;
      Abc_Print(-1,"Cannot open NPN function file \"%s\".\n",pFileName);
    }
    else {
      fclose(__stream);
      iVar1 = Extra_FileSize(pFileName);
      iVar7 = (iVar1 / 0x14) * 4;
      p->nBufferSize = iVar7;
      pNVar3 = (Npn_Obj_t *)malloc((long)iVar7 << 4);
      p->pBuffer = pNVar3;
      uVar6 = (iVar1 / 0x14) * 2 - 1;
      while( true ) {
        do {
          uVar5 = uVar6 + 1;
          uVar2 = uVar6 & 1;
          uVar6 = uVar5;
        } while (uVar2 != 0);
        if (uVar5 < 9) break;
        iVar7 = 5;
        while (uVar5 % (iVar7 - 2U) != 0) {
          uVar2 = iVar7 * iVar7;
          iVar7 = iVar7 + 2;
          if (uVar5 < uVar2) goto LAB_002e8deb;
        }
      }
LAB_002e8deb:
      p->nBins = uVar5;
      piVar4 = (int *)calloc((long)(int)uVar5,4);
      p->pBins = piVar4;
      p->nEntries = 1;
      Npn_ManRead(p,pFileName);
    }
  }
  return p;
}

Assistant:

Npn_Man_t * Npn_ManStart( char * pFileName )
{
    Npn_Man_t * p;
    p = ABC_CALLOC( Npn_Man_t, 1 );
    if ( pFileName == NULL )
    {
        p->nBufferSize = 1000000;
        p->nBufferSize = 100;
        p->pBuffer     = ABC_ALLOC( Npn_Obj_t, p->nBufferSize );
        p->nBins       = Abc_PrimeCudd( p->nBufferSize / 2 );
        p->pBins       = ABC_CALLOC( int, p->nBins );
        p->nEntries    = 1;
    }
    else
    {
        FILE * pFile = fopen( pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Cannot open NPN function file \"%s\".\n", pFileName );
            return NULL;
        }
        fclose( pFile );
        p->nBufferSize = 4 * ( Extra_FileSize(pFileName) / 20 );
        p->pBuffer     = ABC_ALLOC( Npn_Obj_t, p->nBufferSize );
        p->nBins       = Abc_PrimeCudd( p->nBufferSize / 2 );
        p->pBins       = ABC_CALLOC( int, p->nBins );
        p->nEntries    = 1;
        Npn_ManRead( p, pFileName );
    }
    return p;
}